

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool do_ppzz_flags(DisasContext_conflict1 *s,arg_rprr_esz *a,gen_helper_gvec_flags_4 *gen_fn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_ptr pTVar1;
  _Bool _Var2;
  uint32_t uVar3;
  int iVar4;
  TCGv_i32 t_00;
  TCGv_ptr r;
  TCGv_ptr r_00;
  TCGv_ptr r_01;
  TCGv_ptr r_02;
  TCGv_i32 t;
  uint vsz;
  TCGv_ptr pg;
  TCGv_ptr zm;
  TCGv_ptr zn;
  TCGv_ptr pd;
  TCGContext_conflict1 *tcg_ctx;
  gen_helper_gvec_flags_4 *gen_fn_local;
  arg_rprr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (gen_fn == (gen_helper_gvec_flags_4 *)0x0) {
    s_local._7_1_ = false;
  }
  else {
    _Var2 = sve_access_check_aarch64(s);
    if (_Var2) {
      uVar3 = vec_full_reg_size(s);
      uVar3 = simd_desc_aarch64(uVar3,uVar3,0);
      t_00 = tcg_const_i32_aarch64(tcg_ctx_00,uVar3);
      r = tcg_temp_new_ptr(tcg_ctx_00);
      r_00 = tcg_temp_new_ptr(tcg_ctx_00);
      r_01 = tcg_temp_new_ptr(tcg_ctx_00);
      r_02 = tcg_temp_new_ptr(tcg_ctx_00);
      pTVar1 = tcg_ctx_00->cpu_env;
      iVar4 = pred_full_reg_offset(s,a->rd);
      tcg_gen_addi_ptr(tcg_ctx_00,r,pTVar1,(long)iVar4);
      pTVar1 = tcg_ctx_00->cpu_env;
      iVar4 = vec_full_reg_offset(s,a->rn);
      tcg_gen_addi_ptr(tcg_ctx_00,r_00,pTVar1,(long)iVar4);
      pTVar1 = tcg_ctx_00->cpu_env;
      iVar4 = vec_full_reg_offset(s,a->rm);
      tcg_gen_addi_ptr(tcg_ctx_00,r_01,pTVar1,(long)iVar4);
      pTVar1 = tcg_ctx_00->cpu_env;
      iVar4 = pred_full_reg_offset(s,a->pg);
      tcg_gen_addi_ptr(tcg_ctx_00,r_02,pTVar1,(long)iVar4);
      (*gen_fn)(tcg_ctx_00,t_00,r,r_00,r_01,r_02,t_00);
      tcg_temp_free_ptr(tcg_ctx_00,r);
      tcg_temp_free_ptr(tcg_ctx_00,r_00);
      tcg_temp_free_ptr(tcg_ctx_00,r_01);
      tcg_temp_free_ptr(tcg_ctx_00,r_02);
      do_pred_flags(tcg_ctx_00,t_00);
      tcg_temp_free_i32(tcg_ctx_00,t_00);
      s_local._7_1_ = true;
    }
    else {
      s_local._7_1_ = true;
    }
  }
  return s_local._7_1_;
}

Assistant:

static bool do_ppzz_flags(DisasContext *s, arg_rprr_esz *a,
                          gen_helper_gvec_flags_4 *gen_fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_ptr pd, zn, zm, pg;
    unsigned vsz;
    TCGv_i32 t;

    if (gen_fn == NULL) {
        return false;
    }
    if (!sve_access_check(s)) {
        return true;
    }

    vsz = vec_full_reg_size(s);
    t = tcg_const_i32(tcg_ctx, simd_desc(vsz, vsz, 0));
    pd = tcg_temp_new_ptr(tcg_ctx);
    zn = tcg_temp_new_ptr(tcg_ctx);
    zm = tcg_temp_new_ptr(tcg_ctx);
    pg = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, pd, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->rd));
    tcg_gen_addi_ptr(tcg_ctx, zn, tcg_ctx->cpu_env, vec_full_reg_offset(s, a->rn));
    tcg_gen_addi_ptr(tcg_ctx, zm, tcg_ctx->cpu_env, vec_full_reg_offset(s, a->rm));
    tcg_gen_addi_ptr(tcg_ctx, pg, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->pg));

    gen_fn(tcg_ctx, t, pd, zn, zm, pg, t);

    tcg_temp_free_ptr(tcg_ctx, pd);
    tcg_temp_free_ptr(tcg_ctx, zn);
    tcg_temp_free_ptr(tcg_ctx, zm);
    tcg_temp_free_ptr(tcg_ctx, pg);

    do_pred_flags(tcg_ctx, t);

    tcg_temp_free_i32(tcg_ctx, t);
    return true;
}